

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnndec.c
# Opt level: O1

rnndecaddrinfo *
trymatch(rnndeccontext *ctx,rnndelem **elems,int elemsnum,uint64_t addr,int write,int dwidth,
        uint64_t *indices,int indicesnum)

{
  char **__ptr;
  rnnetype rVar1;
  rnndelem **pprVar2;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  bool bVar6;
  size_t __n;
  void *pvVar7;
  int iVar8;
  rnndeccontext *prVar9;
  int iVar10;
  rnndelem *prVar11;
  rnndecaddrinfo *prVar12;
  ulong uVar13;
  ulong uVar14;
  char *pcVar15;
  uint64_t uVar16;
  ulong *puVar17;
  undefined4 in_register_0000008c;
  undefined1 *puVar18;
  ulong uVar19;
  uint64_t addr_00;
  ulong local_a8;
  size_t local_a0;
  long local_98;
  undefined1 *local_90;
  ulong local_88;
  uint64_t local_80;
  ulong local_78;
  void *local_70;
  rnndelem **local_68;
  int local_5c;
  char *local_58;
  char *tmp;
  rnndeccontext *local_48;
  rnndecaddrinfo *local_40;
  char *local_38;
  char *name;
  
  local_70 = (void *)CONCAT44(in_register_0000008c,dwidth);
  puVar17 = &local_a8;
  if (0 < elemsnum) {
    local_98 = (long)(int)indices;
    local_78 = (ulong)indices & 0xffffffff;
    local_a0 = local_78 * 8;
    local_a8 = (ulong)(uint)elemsnum;
    uVar19 = 0;
    local_80 = addr;
    local_68 = elems;
    local_5c = write;
    local_48 = ctx;
    do {
      prVar11 = elems[uVar19];
      *(undefined8 *)((long)puVar17 + -8) = 0x173198;
      iVar10 = rnndec_varmatch(ctx,&prVar11->varinfo);
      prVar9 = local_48;
      if (iVar10 != 0) {
        prVar11 = elems[uVar19];
        rVar1 = prVar11->type;
        bVar6 = true;
        if (rVar1 == RNN_ETYPE_REG) {
          pcVar15 = (char *)(local_80 - prVar11->offset);
          if (prVar11->offset <= local_80) {
            uVar14 = prVar11->stride;
            if (uVar14 == 0) {
              puVar18 = (undefined1 *)0x0;
            }
            else {
              puVar18 = (undefined1 *)((ulong)pcVar15 / uVar14);
              pcVar15 = (char *)((ulong)pcVar15 % uVar14);
            }
            iVar10 = prVar11->width;
            if ((pcVar15 < (char *)(long)(iVar10 / local_5c)) &&
               (puVar18 <= (undefined1 *)(prVar11->length - 1))) {
              local_90 = puVar18;
              tmp = pcVar15;
              *(undefined8 *)((long)puVar17 + -8) = 0x173510;
              local_40 = (rnndecaddrinfo *)calloc(0x18,1);
              local_40->typeinfo = &prVar11->typeinfo;
              local_40->width = iVar10;
              __ptr = &local_40->name;
              pcVar15 = prVar11->name;
              pcVar3 = local_48->colors->cname;
              pcVar4 = local_48->colors->cend;
              *(undefined8 *)((long)puVar17 + -8) = 0x17354d;
              asprintf(__ptr,"%s%s%s",pcVar3,pcVar15,pcVar4);
              pvVar7 = local_70;
              uVar14 = local_78;
              if (0 < (int)indices) {
                uVar13 = 0;
                do {
                  prVar9 = local_48;
                  pcVar15 = *__ptr;
                  uVar16 = *(uint64_t *)((long)pvVar7 + uVar13 * 8);
                  *(undefined8 *)((long)puVar17 + -8) = 0x17356d;
                  pcVar15 = appendidx(prVar9,pcVar15,uVar16);
                  *__ptr = pcVar15;
                  uVar13 = uVar13 + 1;
                } while (uVar14 != uVar13);
              }
              prVar9 = local_48;
              puVar18 = local_90;
              if (local_68[uVar19]->length != 1) {
                pcVar15 = *__ptr;
                *(undefined8 *)((long)puVar17 + -8) = 0x17359d;
                pcVar15 = appendidx(prVar9,pcVar15,(uint64_t)puVar18);
                *__ptr = pcVar15;
              }
              if (tmp == (char *)0x0) goto LAB_0017362e;
              pcVar15 = *__ptr;
              pcVar3 = prVar9->colors->cerr;
              bVar6 = false;
              *(undefined8 *)((long)puVar17 + -8) = 0x1735d0;
              asprintf(&local_58,"%s+%s%#lx%s",pcVar15,pcVar3);
              pcVar15 = *__ptr;
              *(undefined8 *)((long)puVar17 + -8) = 0x1735d8;
              free(pcVar15);
              *__ptr = local_58;
            }
          }
        }
        else {
          local_88 = uVar19;
          if (rVar1 == RNN_ETYPE_ARRAY) {
            uVar14 = local_80 - prVar11->offset;
            if (prVar11->offset <= local_80) {
              uVar13 = uVar14 / prVar11->stride;
              if (uVar13 <= prVar11->length - 1) {
                pcVar15 = prVar11->name;
                pcVar3 = local_48->colors->cname;
                pcVar4 = local_48->colors->cend;
                tmp = (char *)(uVar14 % prVar11->stride);
                *(undefined8 *)((long)puVar17 + -8) = 0x1733ea;
                asprintf(&local_38,"%s%s%s",pcVar3,pcVar15,pcVar4);
                pvVar7 = local_70;
                uVar19 = local_78;
                if (0 < (int)indices) {
                  uVar14 = 0;
                  do {
                    pcVar15 = local_38;
                    uVar16 = *(uint64_t *)((long)pvVar7 + uVar14 * 8);
                    *(undefined8 *)((long)puVar17 + -8) = 0x17340a;
                    local_38 = appendidx(prVar9,pcVar15,uVar16);
                    uVar14 = uVar14 + 1;
                  } while (uVar19 != uVar14);
                }
                pcVar15 = local_38;
                uVar19 = local_88;
                if (local_68[local_88]->length != 1) {
                  *(undefined8 *)((long)puVar17 + -8) = 0x173438;
                  local_38 = appendidx(prVar9,pcVar15,uVar13);
                }
                pcVar15 = tmp;
                iVar8 = local_5c;
                pprVar2 = local_68[uVar19]->subelems;
                iVar10 = local_68[uVar19]->subelemsnum;
                *(undefined8 *)((long)puVar17 + -0x10) = 0;
                *(undefined8 *)((long)puVar17 + -0x18) = 0x173467;
                prVar12 = trymatch(prVar9,pprVar2,iVar10,(uint64_t)pcVar15,iVar8,0,
                                   *(uint64_t **)((long)puVar17 + -0x10),
                                   *(int *)((long)puVar17 + -8));
                pcVar3 = local_38;
                if (prVar12 == (rnndecaddrinfo *)0x0) {
                  *(undefined8 *)((long)puVar17 + -8) = 0x1735f0;
                  prVar12 = (rnndecaddrinfo *)calloc(0x18,1);
                  pcVar4 = local_38;
                  pcVar3 = prVar9->colors->cerr;
                  *(undefined8 *)((long)puVar17 + -8) = 0x173619;
                  asprintf(&local_58,"%s+%s%#lx%s",pcVar4,pcVar3,pcVar15);
                  pcVar15 = local_38;
                }
                else {
                  pcVar15 = prVar12->name;
                  *(undefined8 *)((long)puVar17 + -8) = 0x173491;
                  asprintf(&local_58,"%s.%s",pcVar3,pcVar15);
                  pcVar15 = local_38;
                  *(undefined8 *)((long)puVar17 + -8) = 0x17349a;
                  free(pcVar15);
                  pcVar15 = prVar12->name;
                }
                *(undefined8 *)((long)puVar17 + -8) = 0x173622;
                free(pcVar15);
                prVar12->name = local_58;
                local_40 = prVar12;
LAB_0017362e:
                bVar6 = false;
              }
            }
          }
          else if (rVar1 == RNN_ETYPE_STRIPE) {
            prVar11 = elems[uVar19];
            uVar16 = prVar11->length;
            pcVar15 = (char *)0x0;
            puVar18 = (undefined1 *)puVar17;
            do {
              pvVar7 = local_70;
              __n = local_a0;
              tmp = pcVar15;
              uVar14 = prVar11->stride * (long)pcVar15 + prVar11->offset;
              addr_00 = local_80 - uVar14;
              puVar17 = (ulong *)puVar18;
              if (local_80 < uVar14) break;
              local_90 = puVar18;
              uVar5 = (uint)(uVar16 != 1) + (int)indices;
              if (prVar11->name != (char *)0x0) {
                uVar5 = 0;
              }
              puVar18 = puVar18 + -((ulong)uVar5 * 8 + 0xf & 0xfffffffffffffff0);
              prVar11 = elems[uVar19];
              if (prVar11->name == (char *)0x0) {
                if (0 < (int)indices) {
                  *(undefined8 *)(puVar18 + -8) = 0x17324f;
                  memcpy(puVar18,pvVar7,__n);
                }
                if (uVar16 != 1) {
                  *(char **)(puVar18 + local_98 * 8) = tmp;
                }
              }
              prVar9 = local_48;
              iVar8 = local_5c;
              pprVar2 = prVar11->subelems;
              iVar10 = prVar11->subelemsnum;
              *(ulong *)(puVar18 + -0x10) = (ulong)uVar5;
              *(undefined8 *)(puVar18 + -0x18) = 0x173285;
              prVar12 = trymatch(prVar9,pprVar2,iVar10,addr_00,iVar8,(int)puVar18,
                                 *(uint64_t **)(puVar18 + -0x10),*(int *)(puVar18 + -8));
              prVar9 = local_48;
              pvVar7 = local_70;
              uVar19 = local_88;
              elems = local_68;
              if (prVar12 != (rnndecaddrinfo *)0x0) {
                pcVar15 = local_68[local_88]->name;
                if (pcVar15 != (char *)0x0) {
                  pcVar3 = local_48->colors->cname;
                  pcVar4 = local_48->colors->cend;
                  *(undefined8 *)(puVar18 + -8) = 0x1732d8;
                  asprintf(&local_38,"%s%s%s",pcVar3,pcVar15,pcVar4);
                  uVar19 = local_78;
                  if (0 < (int)indices) {
                    uVar14 = 0;
                    do {
                      pcVar15 = local_38;
                      uVar16 = *(uint64_t *)((long)pvVar7 + uVar14 * 8);
                      *(undefined8 *)(puVar18 + -8) = 0x1732f4;
                      local_38 = appendidx(prVar9,pcVar15,uVar16);
                      uVar14 = uVar14 + 1;
                    } while (uVar19 != uVar14);
                  }
                  pcVar3 = local_38;
                  pcVar15 = tmp;
                  elems = local_68;
                  uVar19 = local_88;
                  if (local_68[local_88]->length != 1) {
                    *(undefined8 *)(puVar18 + -8) = 0x173323;
                    local_38 = appendidx(prVar9,pcVar3,(uint64_t)pcVar15);
                  }
                  pcVar3 = local_38;
                  pcVar15 = prVar12->name;
                  *(undefined8 *)(puVar18 + -8) = 0x173341;
                  asprintf(&local_58,"%s.%s",pcVar3,pcVar15);
                  pcVar15 = local_38;
                  *(undefined8 *)(puVar18 + -8) = 0x17334a;
                  free(pcVar15);
                  pcVar15 = prVar12->name;
                  *(undefined8 *)(puVar18 + -8) = 0x173353;
                  free(pcVar15);
                  prVar12->name = local_58;
                }
                local_40 = prVar12;
              }
              puVar17 = (ulong *)local_90;
              if (prVar12 != (rnndecaddrinfo *)0x0) goto LAB_0017362e;
              pcVar15 = tmp + 1;
              prVar11 = elems[uVar19];
              uVar16 = prVar11->length;
              puVar18 = local_90;
            } while (pcVar15 <= (char *)(uVar16 - 1));
            bVar6 = true;
          }
        }
        ctx = local_48;
        elems = local_68;
        if (!bVar6) {
          return local_40;
        }
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != local_a8);
  }
  return (rnndecaddrinfo *)0x0;
}

Assistant:

static struct rnndecaddrinfo *trymatch (struct rnndeccontext *ctx, struct rnndelem **elems, int elemsnum, uint64_t addr, int write, int dwidth, uint64_t *indices, int indicesnum) {
	struct rnndecaddrinfo *res;
	int i, j;
	for (i = 0; i < elemsnum; i++) {
		if (!rnndec_varmatch(ctx, &elems[i]->varinfo))
			continue;
		uint64_t offset, idx;
		char *tmp, *name;
		switch (elems[i]->type) {
			case RNN_ETYPE_REG:
				if (addr < elems[i]->offset)
					break;
				if (elems[i]->stride) {
					idx = (addr-elems[i]->offset)/elems[i]->stride;
					offset = (addr-elems[i]->offset)%elems[i]->stride;
				} else {
					idx = 0;
					offset = addr-elems[i]->offset;
				}
				if (offset >= elems[i]->width/dwidth)
					break;
				if (elems[i]->length && idx >= elems[i]->length)
					break;
				res = calloc (sizeof *res, 1);
				res->typeinfo = &elems[i]->typeinfo;
				res->width = elems[i]->width;
				asprintf (&res->name, "%s%s%s", ctx->colors->cname, elems[i]->name, ctx->colors->cend);
				for (j = 0; j < indicesnum; j++)
					res->name = appendidx(ctx, res->name, indices[j]);
				if (elems[i]->length != 1)
					res->name = appendidx(ctx, res->name, idx);
				if (offset) {
					asprintf (&tmp, "%s+%s%#"PRIx64"%s", res->name, ctx->colors->cerr, offset, ctx->colors->cend);
					free(res->name);
					res->name = tmp;
				}
				return res;
			case RNN_ETYPE_STRIPE:
				for (idx = 0; idx < elems[i]->length || !elems[i]->length; idx++) {
					if (addr < elems[i]->offset + elems[i]->stride * idx)
						break;
					offset = addr - (elems[i]->offset + elems[i]->stride * idx);
					int extraidx = (elems[i]->length != 1);
					int nindnum = (elems[i]->name ? 0 : indicesnum + extraidx);
					uint64_t nind[nindnum];
					if (!elems[i]->name) {
						for (j = 0; j < indicesnum; j++)
							nind[j] = indices[j];
						if (extraidx)
							nind[indicesnum] = idx;
					}
					res = trymatch (ctx, elems[i]->subelems, elems[i]->subelemsnum, offset, write, dwidth, nind, nindnum);
					if (!res)
						continue;
					if (!elems[i]->name)
						return res;
					asprintf (&name, "%s%s%s", ctx->colors->cname, elems[i]->name, ctx->colors->cend);
					for (j = 0; j < indicesnum; j++)
						name = appendidx(ctx, name, indices[j]);
					if (elems[i]->length != 1)
						name = appendidx(ctx, name, idx);
					asprintf (&tmp, "%s.%s", name, res->name);
					free(name);
					free(res->name);
					res->name = tmp;
					return res;
				}
				break;
			case RNN_ETYPE_ARRAY:
				if (addr < elems[i]->offset)
					break;
				idx = (addr-elems[i]->offset)/elems[i]->stride;
				offset = (addr-elems[i]->offset)%elems[i]->stride;
				if (elems[i]->length && idx >= elems[i]->length)
					break;
				asprintf (&name, "%s%s%s", ctx->colors->cname, elems[i]->name, ctx->colors->cend);
				for (j = 0; j < indicesnum; j++)
					name = appendidx(ctx, name, indices[j]);
				if (elems[i]->length != 1)
					name = appendidx(ctx, name, idx);
				if ((res = trymatch (ctx, elems[i]->subelems, elems[i]->subelemsnum, offset, write, dwidth, 0, 0))) {
					asprintf (&tmp, "%s.%s", name, res->name);
					free(name);
					free(res->name);
					res->name = tmp;
					return res;
				}
				res = calloc (sizeof *res, 1);
				asprintf (&tmp, "%s+%s%#"PRIx64"%s", name, ctx->colors->cerr, offset, ctx->colors->cend);
				free(name);
				res->name = tmp;
				return res;
			default:
				break;
		}
	}
	return 0;
}